

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.cpp
# Opt level: O0

NS * __thiscall NS::get_all(NS *this,Prep preposition)

{
  bool bVar1;
  NS *in_RDI;
  N *n;
  iterator __end1;
  iterator __begin1;
  vector<N_*,_std::allocator<N_*>_> *__range1;
  NS *res;
  N *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> local_30 [2];
  undefined1 local_19;
  
  local_19 = 0;
  NS((NS *)0x1960d4);
  local_30[0]._M_current =
       (N **)std::vector<N_*,_std::allocator<N_*>_>::begin
                       ((vector<N_*,_std::allocator<N_*>_> *)in_stack_ffffffffffffff88);
  std::vector<N_*,_std::allocator<N_*>_>::end
            ((vector<N_*,_std::allocator<N_*>_> *)in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator==<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>
                           ((__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
                            in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::operator*(local_30)
    ;
    in_stack_ffffffffffffff97 =
         std::function<bool_(N_*)>::operator()
                   ((function<bool_(N_*)> *)
                    CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
    if ((bool)in_stack_ffffffffffffff97) {
      add((NS *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
          in_stack_ffffffffffffff88);
    }
    __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::operator++
              (local_30);
  }
  return in_RDI;
}

Assistant:

NS NS::get_all(Prep preposition) {
    NS res;
    for (auto n : _os) if (preposition(n)) res.add(n);
    return res;
}